

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::alloc
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,int new_len)

{
  undefined8 *puVar1;
  CString *pCVar2;
  uint uVar3;
  int iVar4;
  CString *pCVar5;
  long lVar6;
  string *this_00;
  
  this->list_size = new_len;
  pCVar5 = allocator_default<CLocalizationDatabase::CString>::alloc_array(new_len);
  uVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar3 = this->num_elements;
  }
  if (0 < (int)uVar3) {
    lVar6 = 0;
    pCVar2 = pCVar5;
    do {
      this_00 = &pCVar2->m_Replacement;
      puVar1 = (undefined8 *)((long)&this->list->m_Hash + lVar6);
      *(undefined8 *)((long)(this_00 + -1) + 8) = *puVar1;
      string_base<allocator_default<char>_>::operator=
                (this_00,(string_base<allocator_default<char>_> *)(puVar1 + 1));
      pCVar2 = (CString *)(this_00 + 1);
      lVar6 = lVar6 + 0x18;
    } while ((ulong)uVar3 * 0x18 != lVar6);
  }
  allocator_default<CLocalizationDatabase::CString>::free_array(this->list);
  iVar4 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar4 = this->num_elements;
  }
  this->num_elements = iVar4;
  this->list = pCVar5;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}